

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void duckdb::RLEScanPartialInternal<unsigned_long,true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  data_ptr_t pdVar1;
  unsigned_long uVar2;
  undefined1 auVar3 [16];
  RLEScanState<unsigned_long> *scan_state;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  idx_t iVar8;
  idx_t iVar9;
  unsigned_long *data_pointer;
  rle_count_t *index_pointer;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  scan_state = (RLEScanState<unsigned_long> *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(scan_state->handle).node);
  pdVar1 = ((scan_state->handle).node.ptr)->buffer;
  data_pointer = (unsigned_long *)(pdVar1 + segment->offset + 8);
  index_pointer = (rle_count_t *)(pdVar1 + (ulong)scan_state->rle_count_offset + segment->offset);
  if ((scan_count == 0x800) &&
     (0x7ff < (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry)) {
    RLEScanConstant<unsigned_long>(scan_state,index_pointer,data_pointer,0x800,result);
    return;
  }
  pdVar1 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  auVar3 = _DAT_01d84390;
  auVar11 = _DAT_01d84380;
  uVar10 = scan_count + result_offset;
  if (result_offset < uVar10) {
    iVar8 = scan_state->entry_pos;
    iVar9 = scan_state->position_in_entry;
    do {
      uVar5 = index_pointer[iVar8] - iVar9;
      uVar4 = uVar10 - result_offset;
      uVar2 = data_pointer[iVar8];
      if (uVar4 < uVar5) {
        if (uVar10 != result_offset) {
          lVar6 = uVar4 + (uVar4 == 0);
          lVar7 = lVar6 + -1;
          auVar14._8_4_ = (int)lVar7;
          auVar14._0_8_ = lVar7;
          auVar14._12_4_ = (int)((ulong)lVar7 >> 0x20);
          uVar10 = 0;
          auVar14 = auVar14 ^ auVar3;
          auVar11 = _DAT_01d84380;
          do {
            auVar13 = auVar11 ^ auVar3;
            if ((bool)(~(auVar13._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar13._0_4_ ||
                        auVar14._4_4_ < auVar13._4_4_) & 1)) {
              *(unsigned_long *)(pdVar1 + uVar10 * 8 + result_offset * 8) = uVar2;
            }
            if ((auVar13._12_4_ != auVar14._12_4_ || auVar13._8_4_ <= auVar14._8_4_) &&
                auVar13._12_4_ <= auVar14._12_4_) {
              *(unsigned_long *)(pdVar1 + uVar10 * 8 + result_offset * 8 + 8) = uVar2;
            }
            uVar10 = uVar10 + 2;
            lVar7 = auVar11._8_8_;
            auVar11._0_8_ = auVar11._0_8_ + 2;
            auVar11._8_8_ = lVar7 + 2;
          } while ((lVar6 + 1U & 0xfffffffffffffffe) != uVar10);
          iVar9 = scan_state->position_in_entry;
        }
        scan_state->position_in_entry = iVar9 + uVar4;
        return;
      }
      if (index_pointer[iVar8] != iVar9) {
        lVar6 = uVar5 - 1;
        auVar12._8_4_ = (int)lVar6;
        auVar12._0_8_ = lVar6;
        auVar12._12_4_ = (int)((ulong)lVar6 >> 0x20);
        auVar12 = auVar12 ^ auVar3;
        uVar4 = 0;
        auVar13 = auVar11;
        do {
          auVar14 = auVar13 ^ auVar3;
          if ((bool)(~(auVar12._4_4_ < auVar14._4_4_ ||
                      auVar12._0_4_ < auVar14._0_4_ && auVar14._4_4_ == auVar12._4_4_) & 1)) {
            *(unsigned_long *)(pdVar1 + uVar4 * 8 + result_offset * 8) = uVar2;
          }
          if (auVar14._12_4_ <= auVar12._12_4_ &&
              (auVar14._8_4_ <= auVar12._8_4_ || auVar14._12_4_ != auVar12._12_4_)) {
            *(unsigned_long *)(pdVar1 + uVar4 * 8 + result_offset * 8 + 8) = uVar2;
          }
          uVar4 = uVar4 + 2;
          lVar6 = auVar13._8_8_;
          auVar13._0_8_ = auVar13._0_8_ + 2;
          auVar13._8_8_ = lVar6 + 2;
        } while ((uVar5 + 1 & 0xfffffffffffffffe) != uVar4);
        iVar8 = scan_state->entry_pos;
      }
      result_offset = result_offset + uVar5;
      iVar8 = iVar8 + 1;
      scan_state->entry_pos = iVar8;
      scan_state->position_in_entry = 0;
      iVar9 = 0;
    } while (result_offset < uVar10);
  }
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}